

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezone.cpp
# Opt level: O0

QByteArray * QTimeZone::systemTimeZoneId(void)

{
  bool bVar1;
  QTimeZonePrivate *pQVar2;
  QByteArray *in_RDI;
  long in_FS_OFFSET;
  QByteArray sys;
  QTimeZonePrivate *in_stack_ffffffffffffff98;
  QByteArray *in_stack_ffffffffffffffa0;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_global_tz>_>::operator->
            ((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_global_tz>_> *)
             0x57fcf8);
  pQVar2 = QExplicitlySharedDataPointer<QTimeZonePrivate>::operator->
                     ((QExplicitlySharedDataPointer<QTimeZonePrivate> *)0x57fd00);
  (*pQVar2->_vptr_QTimeZonePrivate[0x13])(&local_20);
  bVar1 = QByteArray::isEmpty((QByteArray *)0x57fd1b);
  if (bVar1) {
    QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_global_tz>_>::operator->
              ((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_global_tz>_> *)
               0x57fd44);
    QExplicitlySharedDataPointer<QTimeZonePrivate>::operator->
              ((QExplicitlySharedDataPointer<QTimeZonePrivate> *)0x57fd55);
    QTimeZonePrivate::id(in_stack_ffffffffffffff98);
  }
  else {
    QByteArray::QByteArray(in_stack_ffffffffffffffa0,(QByteArray *)in_stack_ffffffffffffff98);
  }
  QByteArray::~QByteArray((QByteArray *)0x57fd96);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QByteArray QTimeZone::systemTimeZoneId()
{
    QByteArray sys = global_tz->backend->systemTimeZoneId();
    if (!sys.isEmpty())
        return sys;
    // The system zone, despite the empty ID, may know its real ID anyway:
    return global_tz->backend->id();
}